

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O2

void __thiscall
glcts::TextureBufferOperationsViaCPUWrites::initializeBufferObjectData
          (TextureBufferOperationsViaCPUWrites *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> data;
  long lVar3;
  
  iVar1 = (*((this->super_TextureBufferOperations).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  std::vector<int,_std::allocator<int>_>::vector
            (&data,(ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture
                                << 2),&local_31);
  (*(this->super_TextureBufferOperations).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])
            (this,data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start,
             (ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture << 2)
            );
  lVar4 = (**(code **)(lVar3 + 0xd00))
                    ((this->super_TextureBufferOperations).super_TestCaseBase.m_glExtTokens.
                     TEXTURE_BUFFER,0,
                     (ulong)(uint)((this->super_TextureBufferOperations).
                                   m_n_vectors_in_buffer_texture << 2) << 2,2);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error mapping buffer object\'s data store to client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x330);
  for (uVar5 = 0; uVar6 = (ulong)uVar5,
      uVar6 < (ulong)((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    *(int *)(lVar4 + uVar6 * 4) =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [uVar6];
  }
  (**(code **)(lVar3 + 0x1670))
            ((this->super_TextureBufferOperations).super_TestCaseBase.m_glExtTokens.TEXTURE_BUFFER);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error ummapping buffer object\'s data store from client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x338);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void TextureBufferOperationsViaCPUWrites::initializeBufferObjectData(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	std::vector<glw::GLint> data(m_n_vectors_in_buffer_texture * m_n_vector_components);
	fillBufferWithData(&data[0], m_n_vectors_in_buffer_texture * m_n_vector_components);

	glw::GLint* tempBuffer = (glw::GLint*)gl.mapBufferRange(
		m_glExtTokens.TEXTURE_BUFFER, 0, m_n_vectors_in_buffer_texture * m_n_vector_components * sizeof(glw::GLint),
		GL_MAP_WRITE_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data store to client's address space!");

	for (glw::GLuint i = 0; i < data.size(); ++i)
	{
		tempBuffer[i] = data[i];
	}

	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer object's data store from client's address space!");
}